

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

CBlockIndex * __thiscall Chainstate::FindForkInGlobalIndex(Chainstate *this,CBlockLocator *locator)

{
  int iVar1;
  long lVar2;
  pointer puVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  CBlockIndex *pCVar6;
  CBlockIndex *pCVar7;
  CBlockIndex *unaff_R14;
  uint256 *hash;
  pointer hash_00;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  hash_00 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (locator->vHave).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar8 = hash_00 == puVar3;
  if (!bVar8) {
    do {
      pCVar6 = ::node::BlockManager::LookupBlockIndex(this->m_blockman,hash_00);
      if (pCVar6 == (CBlockIndex *)0x0) {
        bVar9 = true;
      }
      else {
        iVar1 = pCVar6->nHeight;
        if (((long)iVar1 < 0) ||
           (ppCVar4 = (this->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (int)((ulong)((long)(this->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4) >> 3) <=
           iVar1)) {
          pCVar7 = (CBlockIndex *)0x0;
        }
        else {
          pCVar7 = ppCVar4[iVar1];
        }
        if (pCVar7 == pCVar6) {
          bVar9 = false;
          unaff_R14 = pCVar6;
        }
        else {
          pCVar6 = CBlockIndex::GetAncestor
                             (pCVar6,(int)((ulong)((long)(this->m_chain).vChain.
                                                                                                                  
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_chain).vChain.
                                                                                                                
                                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) +
                                     -1);
          ppCVar4 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppCVar5 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar5 == ppCVar4) {
            pCVar7 = (CBlockIndex *)0x0;
          }
          else {
            pCVar7 = ppCVar5[-1];
          }
          bVar9 = pCVar6 != pCVar7;
          if (!bVar9) {
            unaff_R14 = (CBlockIndex *)0x0;
          }
          if ((ppCVar5 != ppCVar4) && (pCVar6 == pCVar7)) {
            bVar9 = false;
            unaff_R14 = ppCVar5[-1];
          }
        }
      }
      if (!bVar9) break;
      hash_00 = hash_00 + 1;
      bVar8 = hash_00 == puVar3;
    } while (!bVar8);
  }
  if (bVar8) {
    ppCVar4 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_finish == ppCVar4) {
      unaff_R14 = (CBlockIndex *)0x0;
    }
    else {
      unaff_R14 = *ppCVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return unaff_R14;
}

Assistant:

const CBlockIndex* Chainstate::FindForkInGlobalIndex(const CBlockLocator& locator) const
{
    AssertLockHeld(cs_main);

    // Find the latest block common to locator and chain - we expect that
    // locator.vHave is sorted descending by height.
    for (const uint256& hash : locator.vHave) {
        const CBlockIndex* pindex{m_blockman.LookupBlockIndex(hash)};
        if (pindex) {
            if (m_chain.Contains(pindex)) {
                return pindex;
            }
            if (pindex->GetAncestor(m_chain.Height()) == m_chain.Tip()) {
                return m_chain.Tip();
            }
        }
    }
    return m_chain.Genesis();
}